

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
 __thiscall kj::anon_unknown_36::HttpInputStreamImpl::readRequestHeaders(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  undefined8 uVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  long in_RSI;
  FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *pFVar4;
  HttpHeaders *this_02;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:1582:7)>
  _kjDefer1582;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  PromiseBase local_38;
  
  handle._M_fr_ptr = operator_new(0x588);
  *(code **)handle._M_fr_ptr = readRequestHeaders;
  *(code **)((long)handle._M_fr_ptr + 8) = readRequestHeaders;
  this_00 = (Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
             *)((long)handle._M_fr_ptr + 0x10);
  *(long *)((long)handle._M_fr_ptr + 0x578) = in_RSI;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_48 = "readRequestHeaders";
  local_40 = 0x420000062c;
  location.function = "readRequestHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x62c;
  location.columnNumber = 0x42;
  kj::_::
  Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  ::Coroutine(this_00,handle,location);
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::
  Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  ::get_return_object((Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                       *)this);
  if (*(char *)(in_RSI + 0xa8) == '\x01') {
    pFVar4 = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)((long)handle._M_fr_ptr + 0x470);
    local_50 = (char *)CONCAT71(local_50._1_7_,true);
    if (*(int *)(in_RSI + 0xb0) == 2) {
      *(undefined4 *)((long)handle._M_fr_ptr + 0x470) = 2;
      uVar2 = *(undefined8 *)(in_RSI + 0xc0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x478) = *(undefined8 *)(in_RSI + 0xb8);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x480) = uVar2;
    }
    else if (*(int *)(in_RSI + 0xb0) == 1) {
      *(undefined4 *)((long)handle._M_fr_ptr + 0x470) = 1;
      uVar2 = *(undefined8 *)(in_RSI + 0xc0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x478) = *(undefined8 *)(in_RSI + 0xb8);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x480) = uVar2;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x488) = *(undefined8 *)(in_RSI + 200);
    }
    kj::_::
    Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::fulfill(this_00,pFVar4);
    if (pFVar4->tag - 1 < 3) {
      pFVar4->tag = 0;
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:1582:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:1582:7)>
                 *)&local_50);
  }
  else {
    this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x570);
    readMessageHeaders(this_01);
    __return_storage_ptr__ =
         (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
         ((long)handle._M_fr_ptr + 0x278);
    co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr__,
               (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x580) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              )(PromiseNode *)local_38.node.ptr;
    }
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
                 ((long)handle._M_fr_ptr + 0x4b0),__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    uVar1 = ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
            ((long)handle._M_fr_ptr + 0x4b0))->tag;
    if (uVar1 == 1) {
      pFVar4 = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)((long)handle._M_fr_ptr + 0x530);
      this_02 = (HttpHeaders *)(*(long *)((long)handle._M_fr_ptr + 0x578) + 0x48);
      HttpHeaders::clear(this_02);
      HttpHeaders::tryParseRequestOrConnect
                (pFVar4,this_02,*(ArrayPtr<char> *)((long)handle._M_fr_ptr + 0x4b8));
      kj::_::
      Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::fulfill(this_00,pFVar4);
    }
    else {
      if (uVar1 != 2) {
        kj::_::unreachable();
      }
      pFVar4 = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)((long)handle._M_fr_ptr + 0x4f0);
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4f0) = 3;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4f8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4b8);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x500) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4c0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x508) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4c8);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x510) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4d0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x518) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4d8);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x520) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4e0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x528) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4e8);
      kj::_::
      Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::fulfill(this_00,pFVar4);
    }
    if (pFVar4->tag - 1 < 3) {
      pFVar4->tag = 0;
    }
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x580) = 1;
  return (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
          )(PromiseNode *)local_38.node.ptr;
}

Assistant:

inline kj::Promise<HttpHeaders::RequestConnectOrProtocolError> readRequestHeaders() {
    KJ_IF_SOME(resuming, resumingRequest) {
      KJ_DEFER(resumingRequest = kj::none);
      co_return HttpHeaders::RequestConnectOrProtocolError(resuming);
    }

    auto textOrError = co_await readMessageHeaders();
    KJ_SWITCH_ONEOF(textOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        headers.clear();
        co_return headers.tryParseRequestOrConnect(text);
      }
    }

    KJ_UNREACHABLE;
  }